

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void xLearn::read_from_disk(string *filename,int task_id)

{
  index_t iVar1;
  DMatrix **matrix_00;
  uint in_ESI;
  int record_num;
  int i;
  DMatrix *matrix;
  OndiskReader reader;
  OndiskReader *in_stack_fffffffffffffed0;
  OndiskReader *this;
  int local_10c;
  DMatrix *in_stack_ffffffffffffff10;
  OndiskReader *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffffa8;
  Reader *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffd8;
  OndiskReader *in_stack_ffffffffffffffe0;
  
  this = (OndiskReader *)&stack0xffffffffffffff10;
  OndiskReader::OndiskReader(in_stack_fffffffffffffed0);
  Reader::SetBlockSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  OndiskReader::Initialize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  matrix_00 = (DMatrix **)operator_new(0x68);
  DMatrix::DMatrix(in_stack_ffffffffffffff10);
  for (local_10c = 0; local_10c < 10; local_10c = local_10c + 1) {
    iVar1 = OndiskReader::Samples(this,matrix_00);
    if (iVar1 == 0) {
      local_10c = local_10c + -1;
      OndiskReader::Reset(in_stack_ffffffffffffff40);
    }
    else {
      in_stack_fffffffffffffed0 = (OndiskReader *)(ulong)in_ESI;
      switch(in_stack_fffffffffffffed0) {
      case (OndiskReader *)0x0:
        CheckLR((DMatrix *)reader.file_ptr_,(bool)reader.super_Reader._215_1_,
                (bool)reader.super_Reader._214_1_);
        break;
      case (OndiskReader *)0x1:
        CheckFFM((DMatrix *)reader.file_ptr_,(bool)reader.super_Reader._215_1_,
                 (bool)reader.super_Reader._214_1_);
        break;
      case (OndiskReader *)0x2:
        CheckCSV((DMatrix *)
                 reader.super_Reader.data_samples_.Y.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start,reader.super_Reader.data_samples_.row.
                          super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
        break;
      case (OndiskReader *)0x3:
        CheckLR((DMatrix *)reader.file_ptr_,(bool)reader.super_Reader._215_1_,
                (bool)reader.super_Reader._214_1_);
        break;
      case (OndiskReader *)0x4:
        CheckFFM((DMatrix *)reader.file_ptr_,(bool)reader.super_Reader._215_1_,
                 (bool)reader.super_Reader._214_1_);
      }
    }
  }
  OndiskReader::~OndiskReader(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void read_from_disk(const std::string& filename, int task_id) {
  OndiskReader reader;
  reader.SetBlockSize(100);
  reader.Initialize(filename);
  DMatrix* matrix = new DMatrix;
  for (int i = 0; i < iteration_num; ++i) {
    int record_num = reader.Samples(matrix);
    if (record_num == 0) {
      --i;
      reader.Reset();
      continue;
    }
    switch(task_id) {
      case 0:
        CheckLR(matrix, true, true);
        break;
      case 1:
        CheckFFM(matrix, true, true);
        break;
      case 2:
        CheckCSV(matrix, true);
        break;
      case 3:
        CheckLR(matrix, false, true);
        break;
      case 4:
        CheckFFM(matrix, false, true);
        break;
    }
  } 
}